

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::remove_children(xml_node *this)

{
  xml_node_struct *pxVar1;
  xml_allocator *alloc;
  xml_node_struct *pxVar2;
  xml_node_struct *n;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    alloc = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
    n = pxVar1->first_child;
    while (n != (xml_node_struct *)0x0) {
      pxVar2 = n->next_sibling;
      impl::anon_unknown_0::destroy_node(n,alloc);
      n = pxVar2;
    }
    this->_root->first_child = (xml_node_struct *)0x0;
  }
  return pxVar1 != (xml_node_struct *)0x0;
}

Assistant:

PUGI__FN bool xml_node::remove_children()
	{
		if (!_root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_node_struct* child = _root->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			impl::destroy_node(child, alloc);

			child = next;
		}

		_root->first_child = 0;

		return true;
	}